

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wcssub.c
# Opt level: O3

int ffgtwcs(fitsfile *fptr,int xcol,int ycol,char **header,int *status)

{
  int iVar1;
  size_t sVar2;
  char *pcVar3;
  char *pcVar4;
  char comm [2];
  int tstatus;
  char valstring [71];
  long tlmax;
  long tlmin;
  int ncols;
  int hdutype;
  char keyname [75];
  char local_10e [2];
  int local_10c;
  char *local_108;
  char *local_100;
  ushort local_f8 [36];
  int local_b0 [2];
  int local_a8 [3];
  int local_9c;
  long local_98;
  int local_8c;
  char local_88 [88];
  
  if (0 < *status) {
    return *status;
  }
  ffghdt(fptr,&local_8c,status);
  if (local_8c == 0) {
    ffpmsg("Can\'t read table WSC keywords. This HDU is not a table");
    *status = 0xeb;
    iVar1 = 0xeb;
  }
  else {
    ffgncl(fptr,&local_9c,status);
    if ((xcol < 1) || (local_9c < xcol)) {
      pcVar3 = "illegal X axis column number in fftwcs";
    }
    else {
      if (0 < ycol && ycol <= local_9c) {
        local_108 = (char *)calloc(1,0x961);
        *header = local_108;
        if (local_108 != (char *)0x0) {
          local_100 = (char *)0x1;
          local_10e[0] = '\0';
          local_10c = 0;
          ffkeyn("TLMIN",xcol,local_88,status);
          ffgkyj(fptr,local_88,(long *)local_a8,(char *)0x0,&local_10c);
          if (local_10c == 0) {
            ffkeyn("TLMAX",xcol,local_88,status);
            ffgkyj(fptr,local_88,(long *)local_b0,(char *)0x0,&local_10c);
            if (local_10c == 0) {
              local_100 = (char *)(long)((local_b0[0] - local_a8[0]) + 1);
            }
          }
          local_10c = 0;
          ffkeyn("TLMIN",ycol,local_88,status);
          ffgkyj(fptr,local_88,(long *)local_a8,(char *)0x0,&local_10c);
          local_98 = 1;
          if (local_10c == 0) {
            ffkeyn("TLMAX",ycol,local_88,status);
            ffgkyj(fptr,local_88,(long *)local_b0,(char *)0x0,&local_10c);
            if (local_10c == 0) {
              local_98 = (long)((local_b0[0] - local_a8[0]) + 1);
            }
          }
          pcVar3 = local_108;
          sVar2 = strlen(local_108);
          builtin_strncpy(pcVar3 + sVar2,"NAXIS   =                    2",0x1f);
          strncat(pcVar3,
                  "                                                                                "
                  ,0x32);
          ffi2c((LONGLONG)local_100,(char *)local_f8,status);
          ffmkky("NAXIS1",(char *)local_f8,local_10e,pcVar3 + 0x50,status);
          strncat(pcVar3 + 0x50,
                  "                                                                                "
                  ,0x32);
          builtin_strncpy(local_88,"NAXIS2",7);
          ffi2c(local_98,(char *)local_f8,status);
          ffmkky(local_88,(char *)local_f8,local_10e,pcVar3 + 0xa0,status);
          strncat(pcVar3 + 0xa0,
                  "                                                                                "
                  ,0x32);
          pcVar3 = pcVar3 + 0xf0;
          local_10c = 0;
          ffkeyn("TCTYP",xcol,local_88,status);
          iVar1 = ffgkey(fptr,local_88,(char *)local_f8,(char *)0x0,&local_10c);
          if (iVar1 != 0) {
            local_f8[0] = local_f8[0] & 0xff00;
          }
          ffmkky("CTYPE1",(char *)local_f8,local_10e,pcVar3,status);
          sVar2 = strlen(pcVar3);
          strncat(pcVar3,
                  "                                                                                "
                  ,(long)(0x50 - (int)sVar2));
          pcVar3 = local_108 + 0x140;
          local_10c = 0;
          ffkeyn("TCTYP",ycol,local_88,status);
          iVar1 = ffgkey(fptr,local_88,(char *)local_f8,(char *)0x0,&local_10c);
          if (iVar1 != 0) {
            local_f8[0] = local_f8[0] & 0xff00;
          }
          ffmkky("CTYPE2",(char *)local_f8,local_10e,pcVar3,status);
          sVar2 = strlen(pcVar3);
          strncat(pcVar3,
                  "                                                                                "
                  ,(long)(0x5000000000 - (sVar2 << 0x20)) >> 0x20);
          pcVar3 = local_108 + 400;
          local_10c = 0;
          ffkeyn("TCRPX",xcol,local_88,status);
          iVar1 = ffgkey(fptr,local_88,(char *)local_f8,(char *)0x0,&local_10c);
          if (iVar1 != 0) {
            local_f8[0] = 0x31;
          }
          ffmkky("CRPIX1",(char *)local_f8,local_10e,pcVar3,status);
          strncat(pcVar3,
                  "                                                                                "
                  ,0x32);
          pcVar3 = local_108 + 0x1e0;
          local_10c = 0;
          ffkeyn("TCRPX",ycol,local_88,status);
          iVar1 = ffgkey(fptr,local_88,(char *)local_f8,(char *)0x0,&local_10c);
          if (iVar1 != 0) {
            local_f8[0] = 0x31;
          }
          ffmkky("CRPIX2",(char *)local_f8,local_10e,pcVar3,status);
          strncat(pcVar3,
                  "                                                                                "
                  ,0x32);
          pcVar3 = local_108 + 0x230;
          local_10c = 0;
          ffkeyn("TCRVL",xcol,local_88,status);
          iVar1 = ffgkey(fptr,local_88,(char *)local_f8,(char *)0x0,&local_10c);
          if (iVar1 != 0) {
            local_f8[0] = 0x31;
          }
          ffmkky("CRVAL1",(char *)local_f8,local_10e,pcVar3,status);
          strncat(pcVar3,
                  "                                                                                "
                  ,0x32);
          pcVar3 = local_108 + 0x280;
          local_10c = 0;
          ffkeyn("TCRVL",ycol,local_88,status);
          iVar1 = ffgkey(fptr,local_88,(char *)local_f8,(char *)0x0,&local_10c);
          if (iVar1 != 0) {
            local_f8[0] = 0x31;
          }
          ffmkky("CRVAL2",(char *)local_f8,local_10e,pcVar3,status);
          strncat(pcVar3,
                  "                                                                                "
                  ,0x32);
          pcVar3 = local_108 + 0x2d0;
          local_10c = 0;
          ffkeyn("TCDLT",xcol,local_88,status);
          iVar1 = ffgkey(fptr,local_88,(char *)local_f8,(char *)0x0,&local_10c);
          if (iVar1 != 0) {
            local_f8[0] = 0x31;
          }
          ffmkky("CDELT1",(char *)local_f8,local_10e,pcVar3,status);
          strncat(pcVar3,
                  "                                                                                "
                  ,0x32);
          pcVar3 = local_108 + 800;
          local_10c = 0;
          ffkeyn("TCDLT",ycol,local_88,status);
          iVar1 = ffgkey(fptr,local_88,(char *)local_f8,(char *)0x0,&local_10c);
          if (iVar1 != 0) {
            local_f8[0] = 0x31;
          }
          ffmkky("CDELT2",(char *)local_f8,local_10e,pcVar3,status);
          strncat(pcVar3,
                  "                                                                                "
                  ,0x32);
          pcVar3 = local_108;
          local_100 = local_108 + 0x370;
          local_10c = 0;
          ffkeyn("TCROT",ycol,local_88,status);
          iVar1 = ffgkey(fptr,local_88,(char *)local_f8,(char *)0x0,&local_10c);
          pcVar4 = local_100;
          if (iVar1 == 0) {
            ffmkky("CROTA2",(char *)local_f8,local_10e,local_100,status);
            strncat(pcVar4,
                    "                                                                                "
                    ,0x32);
            pcVar4 = pcVar3 + 0x3c0;
          }
          local_10c = 0;
          iVar1 = ffgkey(fptr,"EPOCH",(char *)local_f8,(char *)0x0,&local_10c);
          if (iVar1 == 0) {
            ffmkky("EPOCH",(char *)local_f8,local_10e,pcVar4,status);
            sVar2 = strlen(pcVar4);
            strncat(pcVar4,
                    "                                                                                "
                    ,(long)(0x5000000000 - (sVar2 << 0x20)) >> 0x20);
            pcVar4 = pcVar4 + 0x50;
          }
          local_10c = 0;
          iVar1 = ffgkey(fptr,"EQUINOX",(char *)local_f8,(char *)0x0,&local_10c);
          if (iVar1 == 0) {
            ffmkky("EQUINOX",(char *)local_f8,local_10e,pcVar4,status);
            sVar2 = strlen(pcVar4);
            strncat(pcVar4,
                    "                                                                                "
                    ,(long)(0x5000000000 - (sVar2 << 0x20)) >> 0x20);
            pcVar4 = pcVar4 + 0x50;
          }
          local_10c = 0;
          iVar1 = ffgkey(fptr,"RADECSYS",(char *)local_f8,(char *)0x0,&local_10c);
          if (iVar1 == 0) {
            ffmkky("RADECSYS",(char *)local_f8,local_10e,pcVar4,status);
            sVar2 = strlen(pcVar4);
            strncat(pcVar4,
                    "                                                                                "
                    ,(long)(0x5000000000 - (sVar2 << 0x20)) >> 0x20);
            pcVar4 = pcVar4 + 0x50;
          }
          local_10c = 0;
          iVar1 = ffgkey(fptr,"TELESCOP",(char *)local_f8,(char *)0x0,&local_10c);
          if (iVar1 == 0) {
            ffmkky("TELESCOP",(char *)local_f8,local_10e,pcVar4,status);
            sVar2 = strlen(pcVar4);
            strncat(pcVar4,
                    "                                                                                "
                    ,(long)(0x5000000000 - (sVar2 << 0x20)) >> 0x20);
            pcVar4 = pcVar4 + 0x50;
          }
          local_10c = 0;
          iVar1 = ffgkey(fptr,"INSTRUME",(char *)local_f8,(char *)0x0,&local_10c);
          if (iVar1 == 0) {
            ffmkky("INSTRUME",(char *)local_f8,local_10e,pcVar4,status);
            sVar2 = strlen(pcVar4);
            strncat(pcVar4,
                    "                                                                                "
                    ,(long)(0x5000000000 - (sVar2 << 0x20)) >> 0x20);
            pcVar4 = pcVar4 + 0x50;
          }
          local_10c = 0;
          iVar1 = ffgkey(fptr,"DETECTOR",(char *)local_f8,(char *)0x0,&local_10c);
          if (iVar1 == 0) {
            ffmkky("DETECTOR",(char *)local_f8,local_10e,pcVar4,status);
            sVar2 = strlen(pcVar4);
            strncat(pcVar4,
                    "                                                                                "
                    ,(long)(0x5000000000 - (sVar2 << 0x20)) >> 0x20);
            pcVar4 = pcVar4 + 0x50;
          }
          local_10c = 0;
          iVar1 = ffgkey(fptr,"MJD-OBS",(char *)local_f8,(char *)0x0,&local_10c);
          if (iVar1 == 0) {
            ffmkky("MJD-OBS",(char *)local_f8,local_10e,pcVar4,status);
            sVar2 = strlen(pcVar4);
            strncat(pcVar4,
                    "                                                                                "
                    ,(long)(0x5000000000 - (sVar2 << 0x20)) >> 0x20);
            pcVar4 = pcVar4 + 0x50;
          }
          local_10c = 0;
          iVar1 = ffgkey(fptr,"DATE-OBS",(char *)local_f8,(char *)0x0,&local_10c);
          if (iVar1 == 0) {
            ffmkky("DATE-OBS",(char *)local_f8,local_10e,pcVar4,status);
            sVar2 = strlen(pcVar4);
            strncat(pcVar4,
                    "                                                                                "
                    ,(long)(0x5000000000 - (sVar2 << 0x20)) >> 0x20);
            pcVar4 = pcVar4 + 0x50;
          }
          local_10c = 0;
          iVar1 = ffgkey(fptr,"DATE",(char *)local_f8,(char *)0x0,&local_10c);
          if (iVar1 == 0) {
            ffmkky("DATE",(char *)local_f8,local_10e,pcVar4,status);
            sVar2 = strlen(pcVar4);
            strncat(pcVar4,
                    "                                                                                "
                    ,(long)(0x5000000000 - (sVar2 << 0x20)) >> 0x20);
            pcVar4 = pcVar4 + 0x50;
          }
          sVar2 = strlen(pcVar4);
          builtin_strncpy(pcVar4 + sVar2,"END",4);
          strncat(pcVar4,
                  "                                                                                "
                  ,0x4d);
          return *status;
        }
        ffpmsg("error allocating memory for WCS header keywords (fftwcs)");
        *status = 0x71;
        return 0x71;
      }
      pcVar3 = "illegal Y axis column number in fftwcs";
    }
    ffpmsg(pcVar3);
    *status = 0x12e;
    iVar1 = 0x12e;
  }
  return iVar1;
}

Assistant:

int ffgtwcs(fitsfile *fptr,  /* I - FITS file pointer              */
           int xcol,        /* I - column number for the X column  */
           int ycol,        /* I - column number for the Y column  */
           char **header,   /* O - string of all the WCS keywords  */
           int *status)     /* IO - error status                   */
/*
  int fits_get_table_wcs_keys
  Return string containing all the WCS keywords appropriate for the 
  pair of X and Y columns containing the coordinate
  of each event in an event list table.  This string may then be passed
  to Doug Mink's WCS library wcsinit routine, to create and initialize the
  WCS structure.  The calling routine must free the header character string
  when it is no longer needed. 

  THIS ROUTINE IS DEPRECATED. USE fits_hdr2str INSTEAD
*/
{
    int hdutype, ncols, tstatus, length;
    int naxis1 = 1, naxis2 = 1;
    long tlmin, tlmax;
    char keyname[FLEN_KEYWORD];
    char valstring[FLEN_VALUE];
    char comm[2];
    char *cptr;
    /*  construct a string of 80 blanks, for adding fill to the keywords */
                 /*  12345678901234567890123456789012345678901234567890123456789012345678901234567890 */
    char blanks[] = "                                                                                ";

    if (*status > 0)
        return(*status);

    fits_get_hdu_type(fptr, &hdutype, status);
    if (hdutype == IMAGE_HDU)
    {
        ffpmsg("Can't read table WSC keywords. This HDU is not a table");
        return(*status = NOT_TABLE);
    }

    fits_get_num_cols(fptr, &ncols, status);
    
    if (xcol < 1 || xcol > ncols)
    {
        ffpmsg("illegal X axis column number in fftwcs");
        return(*status = BAD_COL_NUM);
    }

    if (ycol < 1 || ycol > ncols)
    {
        ffpmsg("illegal Y axis column number in fftwcs");
        return(*status = BAD_COL_NUM);
    }

    /* allocate character string for all the WCS keywords */
    *header = calloc(1, 2401);  /* room for up to 30 keywords */
    if (*header == 0)
    {
        ffpmsg("error allocating memory for WCS header keywords (fftwcs)");
        return(*status = MEMORY_ALLOCATION);
    }

    cptr = *header;
    comm[0] = '\0';
    
    tstatus = 0;
    ffkeyn("TLMIN",xcol,keyname,status);
    ffgkyj(fptr,keyname, &tlmin,NULL,&tstatus);

    if (!tstatus)
    {
        ffkeyn("TLMAX",xcol,keyname,status);
        ffgkyj(fptr,keyname, &tlmax,NULL,&tstatus);
    }

    if (!tstatus)
    {
        naxis1 = tlmax - tlmin + 1;
    }

    tstatus = 0;
    ffkeyn("TLMIN",ycol,keyname,status);
    ffgkyj(fptr,keyname, &tlmin,NULL,&tstatus);

    if (!tstatus)
    {
        ffkeyn("TLMAX",ycol,keyname,status);
        ffgkyj(fptr,keyname, &tlmax,NULL,&tstatus);
    }

    if (!tstatus)
    {
        naxis2 = tlmax - tlmin + 1;
    }

    /*            123456789012345678901234567890    */
    strcat(cptr, "NAXIS   =                    2");
    strncat(cptr, blanks, 50);
    cptr += 80;

    ffi2c(naxis1, valstring, status);   /* convert to formatted string */
    ffmkky("NAXIS1", valstring, comm, cptr, status);  /* construct the keyword*/
    strncat(cptr, blanks, 50);  /* pad with blanks */
    cptr += 80;

    strcpy(keyname, "NAXIS2");
    ffi2c(naxis2, valstring, status);   /* convert to formatted string */
    ffmkky(keyname, valstring, comm, cptr, status);  /* construct the keyword*/
    strncat(cptr, blanks, 50);  /* pad with blanks */
    cptr += 80;

    /* read the required header keywords (use defaults if not found) */

    /*  CTYPE1 keyword */
    tstatus = 0;
    ffkeyn("TCTYP",xcol,keyname,status);
    if (ffgkey(fptr, keyname, valstring, NULL, &tstatus) )
       valstring[0] =  '\0';
    ffmkky("CTYPE1", valstring, comm, cptr, status);  /* construct the keyword*/
    length = strlen(cptr);
    strncat(cptr, blanks, 80 - length);  /* pad with blanks */
    cptr += 80;

    /*  CTYPE2 keyword */
    tstatus = 0;
    ffkeyn("TCTYP",ycol,keyname,status);
    if (ffgkey(fptr, keyname, valstring, NULL, &tstatus) )
       valstring[0] =  '\0';
    ffmkky("CTYPE2", valstring, comm, cptr, status);  /* construct the keyword*/
    length = strlen(cptr);
    strncat(cptr, blanks, 80 - length);  /* pad with blanks */
    cptr += 80;

    /*  CRPIX1 keyword */
    tstatus = 0;
    ffkeyn("TCRPX",xcol,keyname,status);
    if (ffgkey(fptr, keyname, valstring, NULL, &tstatus) )
       strcpy(valstring, "1");
    ffmkky("CRPIX1", valstring, comm, cptr, status);  /* construct the keyword*/
    strncat(cptr, blanks, 50);  /* pad with blanks */
    cptr += 80;

    /*  CRPIX2 keyword */
    tstatus = 0;
    ffkeyn("TCRPX",ycol,keyname,status);
    if (ffgkey(fptr, keyname, valstring, NULL, &tstatus) )
       strcpy(valstring, "1");
    ffmkky("CRPIX2", valstring, comm, cptr, status);  /* construct the keyword*/
    strncat(cptr, blanks, 50);  /* pad with blanks */
    cptr += 80;

    /*  CRVAL1 keyword */
    tstatus = 0;
    ffkeyn("TCRVL",xcol,keyname,status);
    if (ffgkey(fptr, keyname, valstring, NULL, &tstatus) )
       strcpy(valstring, "1");
    ffmkky("CRVAL1", valstring, comm, cptr, status);  /* construct the keyword*/
    strncat(cptr, blanks, 50);  /* pad with blanks */
    cptr += 80;

    /*  CRVAL2 keyword */
    tstatus = 0;
    ffkeyn("TCRVL",ycol,keyname,status);
    if (ffgkey(fptr, keyname, valstring, NULL, &tstatus) )
       strcpy(valstring, "1");
    ffmkky("CRVAL2", valstring, comm, cptr, status);  /* construct the keyword*/
    strncat(cptr, blanks, 50);  /* pad with blanks */
    cptr += 80;

    /*  CDELT1 keyword */
    tstatus = 0;
    ffkeyn("TCDLT",xcol,keyname,status);
    if (ffgkey(fptr, keyname, valstring, NULL, &tstatus) )
       strcpy(valstring, "1");
    ffmkky("CDELT1", valstring, comm, cptr, status);  /* construct the keyword*/
    strncat(cptr, blanks, 50);  /* pad with blanks */
    cptr += 80;

    /*  CDELT2 keyword */
    tstatus = 0;
    ffkeyn("TCDLT",ycol,keyname,status);
    if (ffgkey(fptr, keyname, valstring, NULL, &tstatus) )
       strcpy(valstring, "1");
    ffmkky("CDELT2", valstring, comm, cptr, status);  /* construct the keyword*/
    strncat(cptr, blanks, 50);  /* pad with blanks */
    cptr += 80;

    /* the following keywords may not exist */

    /*  CROTA2 keyword */
    tstatus = 0;
    ffkeyn("TCROT",ycol,keyname,status);
    if (ffgkey(fptr, keyname, valstring, NULL, &tstatus) == 0 )
    {
        ffmkky("CROTA2", valstring, comm, cptr, status);  /* construct keyword*/
        strncat(cptr, blanks, 50);  /* pad with blanks */
        cptr += 80;
    }

    /*  EPOCH keyword */
    tstatus = 0;
    if (ffgkey(fptr, "EPOCH", valstring, NULL, &tstatus) == 0 )
    {
        ffmkky("EPOCH", valstring, comm, cptr, status);  /* construct keyword*/
        length = strlen(cptr);
        strncat(cptr, blanks, 80 - length);  /* pad with blanks */
        cptr += 80;
    }

    /*  EQUINOX keyword */
    tstatus = 0;
    if (ffgkey(fptr, "EQUINOX", valstring, NULL, &tstatus) == 0 )
    {
        ffmkky("EQUINOX", valstring, comm, cptr, status); /* construct keyword*/
        length = strlen(cptr);
        strncat(cptr, blanks, 80 - length);  /* pad with blanks */
        cptr += 80;
    }

    /*  RADECSYS keyword */
    tstatus = 0;
    if (ffgkey(fptr, "RADECSYS", valstring, NULL, &tstatus) == 0 )
    {
        ffmkky("RADECSYS", valstring, comm, cptr, status); /*construct keyword*/
        length = strlen(cptr);
        strncat(cptr, blanks, 80 - length);  /* pad with blanks */
        cptr += 80;
    }

    /*  TELESCOPE keyword */
    tstatus = 0;
    if (ffgkey(fptr, "TELESCOP", valstring, NULL, &tstatus) == 0 )
    {
        ffmkky("TELESCOP", valstring, comm, cptr, status); 
        length = strlen(cptr);
        strncat(cptr, blanks, 80 - length);  /* pad with blanks */
        cptr += 80;
    }

    /*  INSTRUME keyword */
    tstatus = 0;
    if (ffgkey(fptr, "INSTRUME", valstring, NULL, &tstatus) == 0 )
    {
        ffmkky("INSTRUME", valstring, comm, cptr, status);  
        length = strlen(cptr);
        strncat(cptr, blanks, 80 - length);  /* pad with blanks */
        cptr += 80;
    }

    /*  DETECTOR keyword */
    tstatus = 0;
    if (ffgkey(fptr, "DETECTOR", valstring, NULL, &tstatus) == 0 )
    {
        ffmkky("DETECTOR", valstring, comm, cptr, status);  
        length = strlen(cptr);
        strncat(cptr, blanks, 80 - length);  /* pad with blanks */
        cptr += 80;
    }

    /*  MJD-OBS keyword */
    tstatus = 0;
    if (ffgkey(fptr, "MJD-OBS", valstring, NULL, &tstatus) == 0 )
    {
        ffmkky("MJD-OBS", valstring, comm, cptr, status);  
        length = strlen(cptr);
        strncat(cptr, blanks, 80 - length);  /* pad with blanks */
        cptr += 80;
    }

    /*  DATE-OBS keyword */
    tstatus = 0;
    if (ffgkey(fptr, "DATE-OBS", valstring, NULL, &tstatus) == 0 )
    {
        ffmkky("DATE-OBS", valstring, comm, cptr, status);  
        length = strlen(cptr);
        strncat(cptr, blanks, 80 - length);  /* pad with blanks */
        cptr += 80;
    }

    /*  DATE keyword */
    tstatus = 0;
    if (ffgkey(fptr, "DATE", valstring, NULL, &tstatus) == 0 )
    {
        ffmkky("DATE", valstring, comm, cptr, status);  
        length = strlen(cptr);
        strncat(cptr, blanks, 80 - length);  /* pad with blanks */
        cptr += 80;
    }

    strcat(cptr, "END");
    strncat(cptr, blanks, 77);

    return(*status);
}